

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * __thiscall
ImageTypeManager::image(Image *__return_storage_ptr__,ImageTypeManager *this,uint8_t type)

{
  const_iterator cVar1;
  imageException *this_00;
  uint8_t type_local;
  
  cVar1 = std::
          _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>,_std::_Select1st<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_PenguinV_Image::ImageTemplate<unsigned_char>_>_>_>
          ::find(&(this->_image)._M_t,&type_local);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_image)._M_t._M_impl.super__Rb_tree_header) {
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (__return_storage_ptr__,(ImageTemplate<unsigned_char> *)&cVar1._M_node[1]._M_parent);
    return __return_storage_ptr__;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"Image is not registered");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

PenguinV_Image::Image ImageTypeManager::image( uint8_t type ) const
{
    std::map< uint8_t, PenguinV_Image::Image >::const_iterator image = _image.find( type );
    if ( image == _image.cend() )
        throw imageException( "Image is not registered" );

    return image->second;
}